

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O3

int64_t lj_carith_powi64(int64_t x,int64_t k)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = 1;
  if (k != 0) {
    if (-1 < k) {
      if (k == 0) {
        return 1;
      }
      uVar1 = k & 1;
      while (uVar1 == 0) {
        x = x * x;
        uVar1 = k & 2;
        k = (ulong)k >> 1;
      }
      if (1 < (ulong)k) {
        lVar2 = x * x;
        while ((ulong)k >> 1 != 1) {
          lVar3 = lVar2;
          if ((k & 2U) == 0) {
            lVar3 = 1;
          }
          x = x * lVar3;
          lVar2 = lVar2 * lVar2;
          k = (ulong)k >> 1;
        }
        x = x * lVar2;
      }
      return x;
    }
    if (x == -1) {
      uVar1 = -(ulong)((uint)k & 1) | 1;
    }
    else {
      if (x == 0) {
        return 0x7fffffffffffffff;
      }
      if (x != 1) {
        return 0;
      }
    }
  }
  return uVar1;
}

Assistant:

int64_t lj_carith_powi64(int64_t x, int64_t k)
{
  if (k == 0)
    return 1;
  if (k < 0) {
    if (x == 0)
      return U64x(7fffffff,ffffffff);
    else if (x == 1)
      return 1;
    else if (x == -1)
      return (k & 1) ? -1 : 1;
    else
      return 0;
  }
  return (int64_t)lj_carith_powu64((uint64_t)x, (uint64_t)k);
}